

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_bclr_b_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (ulong)wt * 0x10;
  bVar1 = *(byte *)((env->active_fpu).fpr + wt) & 7;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wd * 0x10;
  *(byte *)((env->active_fpu).fpr + wd) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((env->active_fpu).fpr + ws);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 1) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 1) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 2) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 2) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 2);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 3) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 3) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 3);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 4) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 4) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 4);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 5) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 5) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 5);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 6) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 6) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 6);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 7) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 7) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 8) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 8) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 8);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 9) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 9) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 9);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 10) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 10) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 10);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xb) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xb) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xc) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xc) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xd) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xd) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xe) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xe) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xf) & 7;
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xf) =
       (-2 << bVar1 | 0xfeU >> 8 - bVar1) & *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf);
  return;
}

Assistant:

void helper_msa_bclr_b(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_bclr_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_bclr_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_bclr_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_bclr_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_bclr_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_bclr_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_bclr_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_bclr_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_bclr_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_bclr_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_bclr_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_bclr_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_bclr_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_bclr_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_bclr_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_bclr_df(DF_BYTE, pws->b[15], pwt->b[15]);
}